

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

bool_t ecpCreateJ(ec_o *ec,qr_o *f,octet *A,octet *B,void *stack)

{
  size_t f_deep;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  bool_t bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  code *pcVar10;
  bool_t bVar11;
  long lVar12;
  
  iVar3 = wwCmpW(f->mod,f->n,3);
  bVar11 = 0;
  if (0 < iVar3) {
    memSet(ec,'\0',0xb0);
    ec->d = 3;
    ec->f = f;
    ec->A = (word *)(ec + 1);
    ec->B = &ec[1].hdr.keep + f->n;
    bVar4 = (*f->from)((word *)(ec + 1),A,f,stack);
    if (bVar4 != 0) {
      bVar4 = (*ec->f->from)(ec->B,B,ec->f,stack);
      bVar11 = 0;
      if (bVar4 != 0) {
        zzDoubleMod((word *)stack,f->unity,f->mod,f->n);
        zzAddMod((word *)stack,(word *)stack,f->unity,f->mod,f->n);
        zzNegMod((word *)stack,(word *)stack,f->mod,f->n);
        iVar3 = wwCmp((word *)stack,ec->A,f->n);
        sVar9 = f->n;
        ec->base = ec->B + sVar9;
        ec->order = ec->B + sVar9 + f->n * 2;
        ec->froma = ecpFromAJ;
        ec->toa = ecpToAJ;
        ec->neg = ecpNegJ;
        ec->add = ecpAddJ;
        ec->adda = ecpAddAJ;
        ec->sub = ecpSubJ;
        ec->suba = ecpSubAJ;
        pcVar10 = ecpDblJ;
        if (iVar3 == 0) {
          pcVar10 = ecpDblJA3;
        }
        ec->dbl = pcVar10;
        pcVar10 = ecpTplJ;
        if (iVar3 == 0) {
          pcVar10 = ecpTplJA3;
        }
        ec->dbla = ecpDblAJ;
        ec->tpl = pcVar10;
        sVar9 = f->n;
        f_deep = f->deep;
        sVar5 = ecpAddJ_deep(sVar9,f_deep);
        sVar6 = ecpAddAJ_deep(f->n,f->deep);
        sVar7 = ecpSubJ_deep(f->n,f->deep);
        sVar8 = ecpSubAJ_deep(f->n,f->deep);
        sVar1 = f->n;
        sVar2 = f->deep;
        lVar12 = sVar1 << 6;
        if (iVar3 == 0) {
          lVar12 = sVar1 * 0x38;
        }
        sVar9 = utilMax(8,sVar9 * 0x10 + f_deep,sVar5,sVar6,sVar7,sVar8,sVar1 * 0x10 + sVar2,
                        sVar1 * 0x20 + sVar2,lVar12 + sVar2);
        ec->deep = sVar9;
        (ec->hdr).keep = f->n * 0x28 + 0xb8;
        (ec->hdr).p_count = 6;
        (ec->hdr).o_count = 1;
        bVar11 = 1;
      }
    }
  }
  return bVar11;
}

Assistant:

bool_t ecpCreateJ(ec_o* ec, const qr_o* f, const octet A[], const octet B[], 
	void* stack)
{
	register bool_t bA3;
	word* t;
	// pre
	ASSERT(memIsValid(ec, sizeof(ec_o)));
	ASSERT(gfpIsOperable(f));
	ASSERT(memIsValid(A, f->no)); 
	ASSERT(memIsValid(B, f->no));
	// f->mod > 3?
	if (wwCmpW(f->mod, f->n, 3) <= 0)
		return FALSE;
	// обнулить
	memSetZero(ec, sizeof(ec_o));
	// зафикисровать размерности
	ec->d = 3;
	// запомнить базовое поле
	ec->f = f;
	// сохранить коэффициенты
	ec->A = (word*)ec->descr;
	ec->B = ec->A + f->n;
	if (!qrFrom(ec->A, A, ec->f, stack) || !qrFrom(ec->B, B, ec->f, stack))
		return FALSE;
	// t <- -3
	t = (word*)stack;
	gfpDouble(t, f->unity, f);
	zmAdd(t, t, f->unity, f);
	zmNeg(t, t, f);
	// bA3 <- A == -3?
	bA3 = qrCmp(t, ec->A, f) == 0;
	// подготовить буферы для описания группы точек
	ec->base = ec->B + f->n;
	ec->order = ec->base + 2 * f->n;
	// настроить интерфейсы
	ec->froma = ecpFromAJ;
	ec->toa = ecpToAJ;
	ec->neg = ecpNegJ;
	ec->add = ecpAddJ;
	ec->adda = ecpAddAJ;
	ec->sub = ecpSubJ;
	ec->suba = ecpSubAJ;
	ec->dbl = bA3 ? ecpDblJA3 : ecpDblJ;
	ec->dbla = ecpDblAJ;
	ec->tpl = bA3 ? ecpTplJA3 : ecpTplJ;
	ec->deep = utilMax(8,
		ecpToAJ_deep(f->n, f->deep),
		ecpAddJ_deep(f->n, f->deep),
		ecpAddAJ_deep(f->n, f->deep),
		ecpSubJ_deep(f->n, f->deep),
		ecpSubAJ_deep(f->n, f->deep),
		bA3 ? ecpDblJA3_deep(f->n, f->deep) : ecpDblJ_deep(f->n, f->deep),
		ecpDblAJ_deep(f->n, f->deep),
		bA3 ? ecpTplJA3_deep(f->n, f->deep) : ecpTplJ_deep(f->n, f->deep));
	// настроить
	ec->hdr.keep = sizeof(ec_o) + O_OF_W(5 * f->n + 1);
	ec->hdr.p_count = 6;
	ec->hdr.o_count = 1;
	// все нормально
	bA3 = 0;
	return TRUE;
}